

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O1

void __thiscall BPlusTree::PrintNodeWithoutPtr(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  pointer pfVar2;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    uVar3 = 0;
    do {
      std::ostream::_M_insert<double>((double)pfVar2[uVar3]);
      peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (uVar3 != ((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
      }
      uVar3 = uVar3 + 1;
      peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pfVar2 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void BPlusTree::PrintNodeWithoutPtr(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->keys[i];
        if (i != node->keys.size() - 1) {
            std::cout << " | ";
        }
    }
    std::cout << "]" << std::endl;
}